

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * __thiscall QByteArray::insert(QByteArray *this,qsizetype i,QByteArrayView data)

{
  Data *pDVar1;
  char *pcVar2;
  QByteArrayView data_00;
  size_t __n;
  char *data_01;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  char *str;
  char *local_168;
  back_insert_iterator<QVarLengthArray<char,_256LL>_> local_160;
  undefined1 local_158 [16];
  qsizetype local_148;
  QVLABase<char> local_58;
  long local_38;
  
  data_01 = data.m_data;
  uVar3 = data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_168 = data_01;
  if (0 < (long)uVar3 && -1 < i) {
    lVar4 = (this->d).size;
    if (i < lVar4) {
      pDVar1 = (this->d).d;
      if (((pDVar1 == (Data *)0x0) ||
          (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
         (pcVar2 = (this->d).ptr, pcVar2 + lVar4 <= data_01 || data_01 < pcVar2)) {
        QtPrivate::QPodArrayOps<char>::insert((QPodArrayOps<char> *)this,i,data_01,uVar3);
        (this->d).ptr[(this->d).size] = '\0';
      }
      else {
        memset((QVarLengthArray<char,_256LL> *)local_158,0xaa,0x100);
        local_58.super_QVLABaseBase.a = 0x100;
        local_58.super_QVLABaseBase.s = 0;
        local_58.super_QVLABaseBase.ptr = (QVarLengthArray<char,_256LL> *)local_158;
        if (0x100 < uVar3) {
          QVLABase<char>::reallocate_impl(&local_58,0x100,local_158,0,uVar3);
        }
        uVar3 = uVar3 + 1;
        local_160.container = (QVarLengthArray<char,_256LL> *)local_158;
        do {
          std::back_insert_iterator<QVarLengthArray<char,_256LL>_>::operator=(&local_160,data_01);
          data_01 = data_01 + 1;
          uVar3 = uVar3 - 1;
        } while (1 < uVar3);
        data_00.m_data = (storage_type *)local_58.super_QVLABaseBase.ptr;
        data_00.m_size = local_58.super_QVLABaseBase.s;
        this = insert(this,i,data_00);
        if ((QVarLengthArray<char,_256LL> *)local_58.super_QVLABaseBase.ptr !=
            (QVarLengthArray<char,_256LL> *)local_158) {
          QtPrivate::sizedFree(local_58.super_QVLABaseBase.ptr,local_58.super_QVLABaseBase.a);
        }
      }
    }
    else {
      local_158._0_8_ = (QArrayData *)0x0;
      local_158._8_8_ = (char *)0x0;
      local_148 = 0;
      QArrayDataPointer<char>::detachAndGrow
                (&this->d,GrowsAtEnd,(uVar3 + i) - lVar4,&local_168,
                 (QArrayDataPointer<char> *)local_158);
      lVar4 = (this->d).size;
      __n = i - lVar4;
      if (__n != 0) {
        (this->d).size = i;
        memset((this->d).ptr + lVar4,0x20,__n);
        i = (this->d).size;
      }
      memcpy((this->d).ptr + i,local_168,uVar3);
      lVar4 = uVar3 + (this->d).size;
      (this->d).size = lVar4;
      (this->d).ptr[lVar4] = '\0';
      if ((QArrayData *)local_158._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_158._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_158._0_8_,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &QByteArray::insert(qsizetype i, QByteArrayView data)
{
    const char *str = data.data();
    qsizetype size = data.size();
    if (i < 0 || size <= 0)
        return *this;

    // handle this specially, as QArrayDataOps::insert() doesn't handle out of
    // bounds positions
    if (i >= d->size) {
        // In case when data points into the range or is == *this, we need to
        // defer a call to free() so that it comes after we copied the data from
        // the old memory:
        DataPointer detached{};  // construction is free
        d.detachAndGrow(Data::GrowsAtEnd, (i - d.size) + size, &str, &detached);
        Q_CHECK_PTR(d.data());
        d->copyAppend(i - d->size, ' ');
        d->copyAppend(str, str + size);
        d.data()[d.size] = '\0';
        return *this;
    }

    if (!d->needsDetach() && QtPrivate::q_points_into_range(str, d)) {
        QVarLengthArray a(str, str + size);
        return insert(i, a);
    }

    d->insert(i, str, size);
    d.data()[d.size] = '\0';
    return *this;
}